

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O2

void __thiscall rank::Rank::add(Rank *this,KeyValue *kv)

{
  Value *pVVar1;
  Key key;
  Entry *pEVar2;
  Entry local_38;
  
  key = kv->_key;
  pEVar2 = find(this,key);
  if (pEVar2 == (Entry *)0x0) {
    local_38._key_value._value = kv->_value;
    local_38._order = 0;
    local_38._key_value._key = key;
    std::vector<rank::Entry,_std::allocator<rank::Entry>_>::emplace_back<rank::Entry>
              (&this->_entries,&local_38);
  }
  else {
    pVVar1 = &(pEVar2->_key_value)._value;
    *pVVar1 = *pVVar1 + kv->_value;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this->_dirty = true;
  return;
}

Assistant:

void Rank::add(const KeyValue& kv) {
        auto r = find(kv.key());
        if (!r) {
            _entries.push_back(Entry{kv});
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
        else {
            r->key_value().value_add(kv.value());
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
    }